

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_helpers.hpp
# Opt level: O2

void __thiscall duckdb::QuantileValue::QuantileValue(QuantileValue *this,Value *v)

{
  double dVar1;
  int64_t iVar2;
  byte bVar3;
  hugeint_t hVar4;
  
  Value::Value(&this->val,v);
  dVar1 = Value::GetValue<double>(v);
  this->dbl = dVar1;
  if ((this->val).type_.id_ == DECIMAL) {
    hVar4 = IntegralValue::Get(v);
    this->integral = hVar4;
    bVar3 = DecimalType::GetScale((LogicalType *)this);
    iVar2 = *(int64_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar3 * 0x10 + 8);
    (this->scaling).lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + (ulong)bVar3 * 0x10);
    (this->scaling).upper = iVar2;
  }
  return;
}

Assistant:

explicit QuantileValue(const Value &v) : val(v), dbl(v.GetValue<double>()) {
		const auto &type = val.type();
		switch (type.id()) {
		case LogicalTypeId::DECIMAL: {
			integral = IntegralValue::Get(v);
			scaling = Hugeint::POWERS_OF_TEN[DecimalType::GetScale(type)];
			break;
		}
		default:
			break;
		}
	}